

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

VoidPromiseAndPipeline * __thiscall
capnp::anon_unknown_0::MembraneHook::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,MembraneHook *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  bool bVar1;
  ClientHook *pCVar2;
  MembranePolicy *pMVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  Disposer *pDVar8;
  undefined8 uVar9;
  byte bVar10;
  uint uVar11;
  VoidPromiseAndPipeline result;
  Maybe<capnp::Capability::Client> redirect;
  NullableValue<kj::Promise<void>_> local_f0;
  VoidPromiseAndPipeline local_d8;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_b8;
  undefined1 local_a0 [24];
  NullableValue<capnp::Capability::Client> local_88;
  bool *local_70;
  Own<capnp::ClientHook> local_68;
  Own<capnp::ClientHook> local_58;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_48;
  
  pCVar2 = (this->resolved).ptr.ptr;
  if (pCVar2 == (ClientHook *)0x0) {
    pMVar3 = (this->policy).ptr;
    uVar11 = (uint)methodId;
    local_a0._16_8_ = __return_storage_ptr__;
    if (this->reverse == true) {
      (*((this->inner).ptr)->_vptr_ClientHook[4])(&local_d8);
      pDVar8 = local_d8.promise.super_PromiseBase.node.disposer;
      local_48.isSet = (bool)(char)local_d8.promise.super_PromiseBase.node.disposer;
      local_48._1_3_ = local_d8.promise.super_PromiseBase.node.disposer._1_3_;
      local_48._4_4_ = local_d8.promise.super_PromiseBase.node.disposer._4_4_;
      local_48.field_1._0_4_ = local_d8.promise.super_PromiseBase.node.ptr._0_4_;
      local_48.field_1._4_4_ = local_d8.promise.super_PromiseBase.node.ptr._4_4_;
      local_d8.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      local_d8.promise.super_PromiseBase.node.disposer = pDVar8;
      (*pMVar3->_vptr_MembranePolicy[1])(&local_88,pMVar3,interfaceId,(ulong)uVar11);
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_48);
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_d8);
    }
    else {
      (*((this->inner).ptr)->_vptr_ClientHook[4])(&local_d8);
      local_58.disposer._0_4_ = local_d8.promise.super_PromiseBase.node.disposer._0_4_;
      local_58.disposer._4_4_ = local_d8.promise.super_PromiseBase.node.disposer._4_4_;
      local_58.ptr._0_4_ = local_d8.promise.super_PromiseBase.node.ptr._0_4_;
      local_58.ptr._4_4_ = local_d8.promise.super_PromiseBase.node.ptr._4_4_;
      local_d8.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**pMVar3->_vptr_MembranePolicy)(&local_88,pMVar3,interfaceId,(ulong)uVar11);
      kj::Own<capnp::ClientHook>::dispose(&local_58);
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_d8);
    }
    if (local_88.isSet == true) {
      whenMoreResolved((Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)&local_b8,this);
      __return_storage_ptr__ = (VoidPromiseAndPipeline *)local_a0._16_8_;
      local_d8.promise.super_PromiseBase.node.disposer =
           (Disposer *)
           CONCAT71(local_d8.promise.super_PromiseBase.node.disposer._1_7_,local_b8.isSet);
      if (local_b8.isSet == true) {
        local_d8.promise.super_PromiseBase.node.ptr =
             (PromiseNode *)local_b8.field_1.value.super_PromiseBase.node.disposer;
        local_d8.pipeline.disposer = (Disposer *)local_b8.field_1.value.super_PromiseBase.node.ptr;
        local_b8.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      }
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue(&local_b8);
      cVar7 = (char)local_d8.promise.super_PromiseBase.node.disposer;
      if ((char)local_d8.promise.super_PromiseBase.node.disposer == '\x01') {
        addRef((MembraneHook *)local_a0);
        kj::Promise<kj::Own<capnp::ClientHook>>::attach<kj::Own<capnp::ClientHook>>
                  ((Promise<kj::Own<capnp::ClientHook>> *)&local_f0,
                   (Own<capnp::ClientHook> *)&local_d8.promise.super_PromiseBase.node.ptr);
        newLocalPromiseClient((capnp *)&local_b8,(Promise<kj::Own<capnp::ClientHook>_> *)&local_f0);
        (*(local_b8.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer[1])
                  (__return_storage_ptr__,local_b8.field_1.value.super_PromiseBase.node.disposer,
                   interfaceId,(ulong)uVar11,context);
        kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_b8);
        kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_f0);
        kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)local_a0);
      }
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)&local_d8);
      uVar9 = local_88.field_1.value.hook.ptr;
      if (cVar7 == '\0') {
        local_88.field_1.value.hook.ptr = (ClientHook *)0x0;
        local_68.disposer = local_88.field_1.value.hook.disposer;
        local_d8.promise.super_PromiseBase.node.disposer = local_88.field_1.value.hook.disposer;
        local_d8.promise.super_PromiseBase.node.ptr = (PromiseNode *)uVar9;
        local_68.ptr = (ClientHook *)0x0;
        (*((ClientHook *)uVar9)->_vptr_ClientHook[1])
                  (__return_storage_ptr__,uVar9,interfaceId,(ulong)methodId,context);
        kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_d8);
        kj::Own<capnp::ClientHook>::dispose(&local_68);
      }
    }
    else {
      pCVar2 = (this->inner).ptr;
      (*((this->policy).ptr)->_vptr_MembranePolicy[2])(local_a0);
      local_70 = &this->reverse;
      bVar1 = *local_70;
      local_b8.field_1.value.super_PromiseBase.node.disposer = (Disposer *)operator_new(0xd0);
      uVar9 = local_a0._8_8_;
      bVar10 = bVar1 ^ 1;
      (local_b8.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer =
           (_func_int **)&PTR_getParams_0066eb70;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 8))->
      _vptr_Disposer = (_func_int **)&PTR_disposeImpl_0066ebd0;
      uVar4 = *(undefined4 *)((long)&context->disposer + 4);
      uVar5 = *(undefined4 *)&context->ptr;
      uVar6 = *(undefined4 *)((long)&context->ptr + 4);
      *(undefined4 *)
       &((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x18))->
        _vptr_Disposer = *(undefined4 *)&context->disposer;
      *(undefined4 *)
       ((long)&((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x18))->
               _vptr_Disposer + 4) = uVar4;
      *(undefined4 *)
       &((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x20))->
        _vptr_Disposer = uVar5;
      *(undefined4 *)
       ((long)&((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x20))->
               _vptr_Disposer + 4) = uVar6;
      context->ptr = (CallContextHook *)0x0;
      local_a0._8_8_ = (_func_int **)0x0;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x28))->
      _vptr_Disposer = (_func_int **)local_a0._0_8_;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x30))->
      _vptr_Disposer = (_func_int **)uVar9;
      *(byte *)&((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x38))
                ->_vptr_Disposer = bVar10;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x40))->
      _vptr_Disposer = (_func_int **)&PTR_extractCap_0066e738;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x48))->
      _vptr_Disposer = (_func_int **)0x0;
      local_f0._0_8_ = (long)local_b8.field_1.value.super_PromiseBase.node.disposer + 8;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x50))->
      _vptr_Disposer = (_func_int **)uVar9;
      *(byte *)&((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x58))
                ->_vptr_Disposer = bVar10;
      *(undefined1 *)
       &((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x60))->
        _vptr_Disposer = 0;
      *(undefined1 *)
       &((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x88))->
        _vptr_Disposer = 0;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x90))->
      _vptr_Disposer = (_func_int **)&PTR_extractCap_0066e8e0;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x98))->
      _vptr_Disposer = (_func_int **)0x0;
      ((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0xa0))->
      _vptr_Disposer = (_func_int **)uVar9;
      *(byte *)&((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0xa8))
                ->_vptr_Disposer = bVar10;
      *(undefined1 *)
       &((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0xb0))->
        _vptr_Disposer = 0;
      *(undefined4 *)
       &((Disposer *)((long)local_b8.field_1.value.super_PromiseBase.node.disposer + 0x10))->
        _vptr_Disposer = 1;
      local_f0.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_b8._0_8_ = local_f0._0_8_;
      (*pCVar2->_vptr_ClientHook[1])(&local_d8,pCVar2,interfaceId,(ulong)uVar11);
      kj::Own<capnp::CallContextHook>::dispose((Own<capnp::CallContextHook> *)&local_b8);
      kj::Own<capnp::(anonymous_namespace)::MembraneCallContextHook>::~Own
                ((Own<capnp::(anonymous_namespace)::MembraneCallContextHook> *)&local_f0);
      kj::Own<capnp::MembranePolicy>::dispose((Own<capnp::MembranePolicy> *)local_a0);
      (*((this->policy).ptr)->_vptr_MembranePolicy[3])(&local_f0);
      __return_storage_ptr__ = (VoidPromiseAndPipeline *)local_a0._16_8_;
      bVar1 = local_f0.isSet;
      local_b8.isSet = local_f0.isSet;
      if (local_f0.isSet == true) {
        local_b8.field_1.value.super_PromiseBase.node.disposer =
             local_f0.field_1.value.super_PromiseBase.node.disposer;
        local_b8.field_1.value.super_PromiseBase.node.ptr =
             local_f0.field_1.value.super_PromiseBase.node.ptr;
        local_f0.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue(&local_f0);
      if (bVar1 != false) {
        kj::Promise<void>::exclusiveJoin((Promise<void> *)&local_f0,&local_d8.promise);
        kj::Own<kj::_::PromiseNode>::operator=
                  ((Own<kj::_::PromiseNode> *)&local_d8,(Own<kj::_::PromiseNode> *)&local_f0);
        kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_f0);
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
                ((NullableValue<kj::Promise<void>_> *)&local_b8);
      uVar4 = local_d8.promise.super_PromiseBase.node.ptr._0_4_;
      uVar5 = local_d8.promise.super_PromiseBase.node.ptr._4_4_;
      local_d8.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
           local_d8.promise.super_PromiseBase.node.disposer._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer + 4)
           = local_d8.promise.super_PromiseBase.node.disposer._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr = uVar4;
      *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr + 4) =
           uVar5;
      (*((this->policy).ptr)->_vptr_MembranePolicy[2])(&local_f0);
      kj::
      refcounted<capnp::(anonymous_namespace)::MembranePipelineHook,kj::Own<capnp::PipelineHook>,kj::Own<capnp::MembranePolicy>,bool&>
                ((kj *)&local_b8,&local_d8.pipeline,(Own<capnp::MembranePolicy> *)&local_f0,local_70
                );
      ((Own<capnp::PipelineHook> *)((long)__return_storage_ptr__ + 0x10))->disposer =
           (Disposer *)local_b8._0_8_;
      ((Own<capnp::PipelineHook> *)((long)__return_storage_ptr__ + 0x10))->ptr =
           (PipelineHook *)local_b8.field_1.value.super_PromiseBase.node.disposer;
      local_b8.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
      kj::Own<capnp::(anonymous_namespace)::MembranePipelineHook>::~Own
                ((Own<capnp::(anonymous_namespace)::MembranePipelineHook> *)&local_b8);
      kj::Own<capnp::MembranePolicy>::dispose((Own<capnp::MembranePolicy> *)&local_f0);
      ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline(&local_d8);
    }
    kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&local_88);
  }
  else {
    (*pCVar2->_vptr_ClientHook[1])
              (__return_storage_ptr__,pCVar2,interfaceId,(ulong)methodId,context);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_MAYBE(r, resolved) {
      return r->get()->call(interfaceId, methodId, kj::mv(context));
    }